

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *
Catch::Detail::parseEnums
          (vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *__return_storage_ptr__,
          StringRef enums)

{
  bool bVar1;
  size_type __n;
  size_type extraout_RDX;
  char in_R8B;
  StringRef enumInstance;
  StringRef SVar2;
  StringRef local_90;
  reference local_80;
  StringRef *enumValue;
  iterator __end2;
  iterator __begin2;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *__range2;
  undefined1 local_38 [8];
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> enumValues;
  StringRef enums_local;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *parsed;
  
  SVar2.m_start = (char *)enums.m_size;
  enumValues.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)enums.m_start;
  SVar2.m_size = 0x2c;
  splitStringRef((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)local_38,
                 (Catch *)enumValues.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,SVar2,in_R8B);
  std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::vector(__return_storage_ptr__);
  __n = std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::size
                  ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)local_38);
  std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::reserve
            (__return_storage_ptr__,__n);
  __end2 = std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::begin
                     ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)local_38);
  enumValue = (StringRef *)
              std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::end
                        ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
                                *)&enumValue);
    if (!bVar1) break;
    local_80 = __gnu_cxx::
               __normal_iterator<Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
               ::operator*(&__end2);
    enumInstance.m_size = extraout_RDX;
    enumInstance.m_start = (char *)local_80->m_size;
    SVar2 = anon_unknown_4::extractInstanceName((anon_unknown_4 *)local_80->m_start,enumInstance);
    SVar2 = trim(SVar2);
    local_90 = SVar2;
    std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::push_back
              (__return_storage_ptr__,&local_90);
    __gnu_cxx::
    __normal_iterator<Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
    ::operator++(&__end2);
  }
  std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::~vector
            ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<StringRef> parseEnums(StringRef enums) {
            auto enumValues = splitStringRef(enums, ',');
            std::vector<StringRef> parsed;
            parsed.reserve(enumValues.size());
            for (auto const &enumValue : enumValues) {
                parsed.push_back(trim(extractInstanceName(enumValue)));
            }
            return parsed;
        }